

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.h
# Opt level: O2

tommy_uint32_t tommy_inthash_u32(tommy_uint32_t key)

{
  uint uVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar1 = key * -0x3f >> 0x11 ^ key * -0x3f;
    uVar1 = uVar1 * -0x1ff0 ^ uVar1 * -0x1ff;
    uVar1 = uVar1 * -0x1c00 ^ uVar1 * -7;
    return uVar1 >> 0xf ^ uVar1;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_uint32_t tommy_inthash_u32(tommy_uint32_t key)
{
	key -= key << 6;
	key ^= key >> 17;
	key -= key << 9;
	key ^= key << 4;
	key -= key << 3;
	key ^= key << 10;
	key ^= key >> 15;

	return key;
}